

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.hpp
# Opt level: O2

void __thiscall
helics::CustomTranslatorOperator::~CustomTranslatorOperator(CustomTranslatorOperator *this)

{
  ~CustomTranslatorOperator(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

CustomTranslatorOperator() = default;